

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O0

bool __thiscall
QMakeEvaluator::getMemberArgs
          (QMakeEvaluator *this,ProKey *func,int srclen,ProStringList *args,int *start,int *end)

{
  int iVar1;
  qsizetype qVar2;
  const_reference this_00;
  QMakeEvaluator *this_01;
  QList<ProString> *in_RCX;
  int in_EDX;
  ProString *in_RDI;
  int *in_R8;
  QString *in_R9;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  int dotdot;
  ProString *start_str;
  ProStringRoUser u2_1;
  ProStringRoUser u1_1;
  ProStringRoUser u2;
  ProStringRoUser u1;
  bool ok;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  QMakeEvaluator *in_stack_fffffffffffffe90;
  ProString *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  bool local_111;
  storage_type *local_110;
  undefined1 local_100 [48];
  ProStringRoUser local_d0;
  ProStringRoUser local_c8;
  storage_type *local_c0;
  undefined1 local_b0 [48];
  ProStringRoUser local_80;
  ProStringRoUser local_78 [13];
  byte local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_R8 = 0;
  *(undefined4 *)&(in_R9->d).d = 0;
  qVar2 = QList<ProString>::size(in_RCX);
  if (1 < qVar2) {
    local_9 = 1;
    this_00 = QList<ProString>::at
                        ((QList<ProString> *)in_stack_fffffffffffffe90,
                         CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    iVar1 = ProString::toInt(in_RDI,(bool *)in_stack_fffffffffffffe98,
                             (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    *in_R8 = iVar1;
    if ((local_9 & 1) == 0) {
      qVar2 = QList<ProString>::size(in_RCX);
      if ((qVar2 == 2) &&
         (in_stack_fffffffffffffeac =
               ProString::indexOf(this_00,(QString *)
                                          CONCAT44(in_stack_fffffffffffffeac,
                                                   in_stack_fffffffffffffea8),
                                  (int)((ulong)in_RDI >> 0x20),(CaseSensitivity)in_RDI),
         in_stack_fffffffffffffeac != -1)) {
        ProString::left(in_stack_fffffffffffffe98,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
        iVar1 = ProString::toInt(in_RDI,(bool *)in_stack_fffffffffffffe98,
                                 (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
        *in_R8 = iVar1;
        ProString::~ProString((ProString *)0x2c5b4e);
        if ((local_9 & 1) != 0) {
          ProString::mid((ProString *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                         (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
          iVar1 = ProString::toInt(in_RDI,(bool *)in_stack_fffffffffffffe98,
                                   (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
          *(int *)&(in_R9->d).d = iVar1;
          ProString::~ProString((ProString *)0x2c5ba6);
        }
      }
      if ((local_9 & 1) == 0) {
        local_78[0].m_rs = (QString *)0xaaaaaaaaaaaaaaaa;
        ProStringRoUser::ProStringRoUser
                  ((ProStringRoUser *)in_stack_fffffffffffffe90,
                   (ProString *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                   (QString *)0x2c5be5);
        local_80.m_rs = (QString *)0xaaaaaaaaaaaaaaaa;
        ProStringRoUser::ProStringRoUser
                  ((ProStringRoUser *)in_stack_fffffffffffffe90,
                   (ProString *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                   (QString *)0x2c5c12);
        QByteArrayView::QByteArrayView<38ul>
                  ((QByteArrayView *)in_RDI,(char (*) [38])in_stack_fffffffffffffe98);
        QVar3.m_data = local_c0;
        QVar3.m_size = (qsizetype)local_b0;
        QString::fromLatin1(QVar3);
        ProStringRoUser::str(local_78);
        ProStringRoUser::str(&local_80);
        QString::arg<QString&,QString&>
                  (in_R9,&this_00->m_string,
                   (QString *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        evalError(in_stack_fffffffffffffe90,
                  (QString *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
        QString::~QString((QString *)0x2c5c9e);
        QString::~QString((QString *)0x2c5cab);
        local_111 = false;
        goto LAB_002c5e74;
      }
    }
    else {
      *(int *)&(in_R9->d).d = *in_R8;
      qVar2 = QList<ProString>::size(in_RCX);
      if (qVar2 == 3) {
        QList<ProString>::at
                  ((QList<ProString> *)in_stack_fffffffffffffe90,
                   CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
        iVar1 = ProString::toInt(in_RDI,(bool *)in_stack_fffffffffffffe98,
                                 (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
        *(int *)&(in_R9->d).d = iVar1;
      }
      if ((local_9 & 1) == 0) {
        local_c8.m_rs = (QString *)0xaaaaaaaaaaaaaaaa;
        ProStringRoUser::ProStringRoUser
                  ((ProStringRoUser *)in_stack_fffffffffffffe90,
                   (ProString *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                   (QString *)0x2c5d40);
        local_d0.m_rs = (QString *)0xaaaaaaaaaaaaaaaa;
        QList<ProString>::at
                  ((QList<ProString> *)in_stack_fffffffffffffe90,
                   CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
        ProStringRoUser::ProStringRoUser
                  ((ProStringRoUser *)in_stack_fffffffffffffe90,
                   (ProString *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                   (QString *)0x2c5d7a);
        QByteArrayView::QByteArrayView<36ul>
                  ((QByteArrayView *)in_RDI,(char (*) [36])in_stack_fffffffffffffe98);
        QVar4.m_data = local_110;
        QVar4.m_size = (qsizetype)local_100;
        QString::fromLatin1(QVar4);
        this_01 = (QMakeEvaluator *)ProStringRoUser::str(&local_c8);
        ProStringRoUser::str(&local_d0);
        QString::arg<QString&,QString&>
                  (in_R9,&this_00->m_string,
                   (QString *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        evalError(this_01,(QString *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
        QString::~QString((QString *)0x2c5df7);
        QString::~QString((QString *)0x2c5e01);
        local_111 = false;
        goto LAB_002c5e74;
      }
    }
  }
  if (*in_R8 < 0) {
    *in_R8 = in_EDX + *in_R8;
  }
  if (*(int *)&(in_R9->d).d < 0) {
    *(int *)&(in_R9->d).d = in_EDX + *(int *)&(in_R9->d).d;
  }
  if ((((*in_R8 < 0) || (in_EDX <= *in_R8)) || (*(int *)&(in_R9->d).d < 0)) ||
     (in_EDX <= *(int *)&(in_R9->d).d)) {
    local_111 = false;
  }
  else {
    local_111 = true;
  }
LAB_002c5e74:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_111;
}

Assistant:

bool
QMakeEvaluator::getMemberArgs(const ProKey &func, int srclen, const ProStringList &args,
                              int *start, int *end)
{
    *start = 0, *end = 0;
    if (args.size() >= 2) {
        bool ok = true;
        const ProString &start_str = args.at(1);
        *start = start_str.toInt(&ok);
        if (!ok) {
            if (args.size() == 2) {
                int dotdot = start_str.indexOf(statics.strDotDot);
                if (dotdot != -1) {
                    *start = start_str.left(dotdot).toInt(&ok);
                    if (ok)
                        *end = start_str.mid(dotdot+2).toInt(&ok);
                }
            }
            if (!ok) {
                ProStringRoUser u1(func, m_tmp1);
                ProStringRoUser u2(start_str, m_tmp2);
                evalError(fL1S("%1() argument 2 (start) '%2' invalid.").arg(u1.str(), u2.str()));
                return false;
            }
        } else {
            *end = *start;
            if (args.size() == 3)
                *end = args.at(2).toInt(&ok);
            if (!ok) {
                ProStringRoUser u1(func, m_tmp1);
                ProStringRoUser u2(args.at(2), m_tmp2);
                evalError(fL1S("%1() argument 3 (end) '%2' invalid.").arg(u1.str(), u2.str()));
                return false;
            }
        }
    }
    if (*start < 0)
        *start += srclen;
    if (*end < 0)
        *end += srclen;
    if (*start < 0 || *start >= srclen || *end < 0 || *end >= srclen)
        return false;
    return true;
}